

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O2

void __thiscall
chatra::Class::cumulativeInitializeForPackage
          (Class *this,IErrorReceiver *errorReceiver,StringTable *sTable,IClassFinder *classFinder,
          Node *node)

{
  pointer psVar1;
  Node *node_00;
  undefined8 *puVar2;
  pointer psVar3;
  undefined1 local_c0 [8];
  unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
  varSyncMap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Class *local_50;
  IClassFinder *local_48;
  StringTable *local_40;
  allocator local_31;
  
  this->node = node;
  local_48 = classFinder;
  local_40 = sTable;
  getSyncMap((unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
              *)local_c0,(Class *)node,(Node *)sTable);
  psVar3 = (node->symbols).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (node->symbols).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = this;
  do {
    if (psVar3 == psVar1) {
      std::
      _Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_c0);
      return;
    }
    node_00 = (psVar3->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (node_00->type == Def) {
      if (node_00->sid == Init) {
        std::__cxx11::string::string
                  ((string *)&varSyncMap._M_h._M_single_bucket,
                   "package-level init() cannot be defined in interactive mode",&local_31);
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        errorAtNode(errorReceiver,Error,node_00,(string *)&varSyncMap._M_h._M_single_bucket,
                    &local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        std::__cxx11::string::~string((string *)&varSyncMap._M_h._M_single_bucket);
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = &PTR__exception_0023dab8;
        *(undefined4 *)(puVar2 + 1) = 0x82;
        __cxa_throw(puVar2,&RuntimeException::typeinfo,std::exception::~exception);
      }
      addMethod(&this->methods,errorReceiver,local_40,local_48,node_00,(Class *)0x0);
    }
    else if (node_00->type == Var) {
      addVariables(errorReceiver,&this->methods,
                   (unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
                    *)local_c0,local_50,node_00);
    }
    psVar3 = psVar3 + 1;
  } while( true );
}

Assistant:

void Class::cumulativeInitializeForPackage(IErrorReceiver& errorReceiver, const StringTable* sTable, IClassFinder& classFinder,
		Node* node) {

	chatra_assert(node->blockNodesState == NodeState::Parsed);
	this->node = node;

	std::unordered_map<Node*, Node*> varSyncMap = getSyncMap(node);

	for (auto& n : node->symbols) {
		if (n->type == NodeType::Var)
			addVariables(errorReceiver, methods, varSyncMap, this, n.get());
		else if (n->type == NodeType::Def) {
			if (n->sid == StringId::Init) {
				errorAtNode(errorReceiver, ErrorLevel::Error, n.get(),
						"package-level init() cannot be defined in interactive mode", {});
				throw RuntimeException(StringId::ParserErrorException);
			}
			else
				addMethod(methods, errorReceiver, sTable, classFinder, n.get(), nullptr);
		}
	}
}